

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

int __thiscall TCPConnection::ReadLine(TCPConnection *this,char *buffer,int size)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = false;
  lVar2 = 0;
  do {
    iVar1 = Read(this);
    if (iVar1 == 0xd) {
LAB_00108023:
      iVar1 = 0;
    }
    else if ((char)iVar1 == '\n') {
      bVar4 = true;
      goto LAB_00108023;
    }
    buffer[lVar2] = (char)iVar1;
    lVar3 = lVar2 + 1;
    if ((size + -1 == (int)lVar2) || (lVar2 = lVar3, bVar4)) {
      buffer[lVar3] = '\0';
      return (int)lVar3;
    }
  } while( true );
}

Assistant:

int TCPConnection::ReadLine(char* buffer, int size)
{
    int i;
    char c;
    bool done = false;
    int bytesProcessed = 0;

    while (!done)
    {
        i = Read();
        if (i == -1)
        {
            *buffer = 0;
            break;
        }
        c = (char)i;
        bytesProcessed++;
        switch (c)
        {
        case '\r': *buffer++ = 0; break;
        case '\n':
            *buffer++ = 0;
            done = true;
            break;
        default: *buffer++ = c; break;
        }

        if (bytesProcessed == size)
        {
            break;
        }
    }

    *buffer = 0;
    return bytesProcessed;
}